

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int coprime(uint16_t *a,uint16_t *b)

{
  bool bVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int iszero;
  int i;
  uint16_t t [16];
  uint16_t y [16];
  uint16_t x [16];
  int local_7c;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  int local_4;
  
  local_38 = *in_RDI;
  local_30 = in_RDI[1];
  local_28 = in_RDI[2];
  local_20 = in_RDI[3];
  local_58 = *in_RSI;
  local_50 = in_RSI[1];
  local_48 = in_RSI[2];
  local_40 = in_RSI[3];
  do {
    bVar1 = true;
    for (local_7c = 0; local_7c < 0x10; local_7c = local_7c + 1) {
      if (*(short *)((long)&local_38 + (long)local_7c * 2) != 0) {
        bVar1 = false;
        break;
      }
    }
    if (bVar1) {
      if ((short)local_58 == 1) {
        for (local_7c = 1; local_7c < 0x10; local_7c = local_7c + 1) {
          if (*(short *)((long)&local_58 + (long)local_7c * 2) != 0) {
            return 0;
          }
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
      return local_4;
    }
    mulmod256((uint16_t *)x._0_8_,(uint16_t *)y._24_8_,(uint16_t *)y._16_8_,(uint16_t *)y._8_8_);
    local_58 = local_38;
    local_50 = local_30;
    local_48 = local_28;
    local_40 = local_20;
    local_38 = local_78;
    local_30 = local_70;
    local_28 = local_68;
    local_20 = local_60;
  } while( true );
}

Assistant:

static int coprime(const uint16_t* a, const uint16_t* b) {
    uint16_t x[16], y[16], t[16];
    int i;
    int iszero;
    memcpy(x, a, 32);
    memcpy(y, b, 32);

    /* simple gcd loop: while x!=0, (x,y)=(y%x,x) */
    while (1) {
        iszero = 1;
        for (i = 0; i < 16; ++i) {
            if (x[i] != 0) {
                iszero = 0;
                break;
            }
        }
        if (iszero) break;
        mulmod256(t, y, NULL, x);
        memcpy(y, x, 32);
        memcpy(x, t, 32);
    }

    /* return whether y=1 */
    if (y[0] != 1) return 0;
    for (i = 1; i < 16; ++i) {
        if (y[i] != 0) return 0;
    }
    return 1;
}